

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Supp_Man_t * Supp_ManStart(int nChunkSize,int nStepSize)

{
  Supp_Man_t *pSVar1;
  Vec_Ptr_t *pVVar2;
  
  pSVar1 = (Supp_Man_t *)calloc(1,0x28);
  pSVar1->nChunkSize = nChunkSize;
  pSVar1->nStepSize = nStepSize;
  pVVar2 = Vec_PtrAlloc(1000);
  pSVar1->vMemory = pVVar2;
  pVVar2 = Vec_PtrAlloc(1000);
  pSVar1->vFree = pVVar2;
  return pSVar1;
}

Assistant:

Supp_Man_t * Supp_ManStart( int nChunkSize, int nStepSize )
{
    Supp_Man_t * p;
    p = ABC_ALLOC( Supp_Man_t, 1 );
    memset( p, 0, sizeof(Supp_Man_t) );
    p->nChunkSize = nChunkSize;
    p->nStepSize  = nStepSize;
    p->vMemory    = Vec_PtrAlloc( 1000 );
    p->vFree      = Vec_PtrAlloc( 1000 );
    return p;
}